

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

int lsvm::system::init(EVP_PKEY_CTX *ctx)

{
  object_class *cls;
  int extraout_EAX;
  symbol *psVar1;
  package *pkg;
  
  memory::initialize();
  processes_count = 0;
  processes = 0;
  current_process = 0;
  psVar1 = symbol::new_symbol("system");
  pkg = object::new_package(psVar1);
  psVar1 = symbol::new_symbol("Class");
  Class = object::new_class(pkg,psVar1,(object_class *)0x0,0);
  object::define_class(pkg,Class);
  psVar1 = symbol::new_symbol("Object");
  Object = object::new_class(pkg,psVar1,(object_class *)0x0,0);
  object::define_class(pkg,Object);
  psVar1 = symbol::new_symbol("Nil");
  Nil = object::new_class(pkg,psVar1,Object,0);
  object::define_class(pkg,Nil);
  psVar1 = symbol::new_symbol("Integer");
  Integer = object::new_class(pkg,psVar1,Object,0);
  object::define_class(pkg,Integer);
  cls = Object;
  psVar1 = symbol::new_symbol("hash");
  object::define_method(cls,psVar1,(block *)hash_block);
  return extraout_EAX;
}

Assistant:

void init(){
    lsvm::memory::initialize();
    // initialize process
    processes_count = 0;
    processes = null;
    current_process = null;

    // initialize global package
    package* system = lsvm::object::new_package(sym("system"));

    // initialize Class
    Class = lsvm::object::new_class(system,sym("Class"),null,0);
    lsvm::object::define_class(system,Class);

    Object = lsvm::object::new_class(system,sym("Object"),null,0);
    lsvm::object::define_class(system,Object);

    Nil = lsvm::object::new_class(system,sym("Nil"),Object,0);
    lsvm::object::define_class(system,Nil);

    Integer = lsvm::object::new_class(system,sym("Integer"),Object,0);
    lsvm::object::define_class(system,Integer);

    // defining methods for Object
    lsvm::object::define_method(Object,sym("hash"),&hash_block);
}